

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint len;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  size_t *in_RSI;
  undefined8 *in_RDI;
  uint ADLER32;
  uint FCHECK;
  uint CMFFLG;
  uint FDICT;
  uint FLEVEL;
  uint CMF;
  size_t deflatesize;
  uchar *deflatedata;
  uint error;
  size_t i;
  ucvector outv;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t *outsize_00;
  uchar **out_00;
  size_t *local_48;
  ucvector local_40 [2];
  size_t *local_10;
  undefined8 *local_8;
  
  out_00 = (uchar **)0x0;
  outsize_00 = (size_t *)0x0;
  uVar6 = 0x78;
  uVar5 = 0;
  uVar4 = 0;
  len = 1;
  uVar1 = 0x7801;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ucvector_init_buffer(local_40,(uchar *)*in_RDI,*in_RSI);
  ucvector_push_back((ucvector *)CONCAT44(len,in_stack_ffffffffffffff88),'\0');
  ucvector_push_back((ucvector *)CONCAT44(len,in_stack_ffffffffffffff88),'\0');
  uVar2 = deflate(out_00,outsize_00,(uchar *)CONCAT44(uVar6,uVar5),CONCAT44(uVar4,uVar1),
                  (LodePNGCompressSettings *)CONCAT44(len,in_stack_ffffffffffffff88));
  if (uVar2 == 0) {
    uVar3 = adler32((uchar *)CONCAT44(uVar4,uVar1),len);
    for (local_48 = (size_t *)0x0; local_48 != outsize_00; local_48 = (size_t *)((long)local_48 + 1)
        ) {
      ucvector_push_back((ucvector *)CONCAT44(len,uVar3),'\0');
    }
    lodepng_free((void *)0x9882e0);
    lodepng_add32bitInt((ucvector *)CONCAT44(uVar4,uVar1),len);
  }
  *local_8 = local_40[0].data;
  *local_10 = local_40[0].size;
  return uVar2;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings)
{
  /*initially, *out must be NULL and outsize 0, if you just give some random *out
  that's pointing to a non allocated buffer, this'll crash*/
  ucvector outv;
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
  unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
  unsigned FLEVEL = 0;
  unsigned FDICT = 0;
  unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
  unsigned FCHECK = 31 - CMFFLG % 31;
  CMFFLG += FCHECK;

  /*ucvector-controlled version of the output buffer, for dynamic array*/
  ucvector_init_buffer(&outv, *out, *outsize);

  ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
  ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  if(!error)
  {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    for(i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
    lodepng_free(deflatedata);
    lodepng_add32bitInt(&outv, ADLER32);
  }

  *out = outv.data;
  *outsize = outv.size;

  return error;
}